

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O2

double __thiscall simpleExpressionEvaluator::ExpressionEvaluator::_expr(ExpressionEvaluator *this)

{
  double dVar1;
  allocator<char> local_79;
  double local_78;
  string local_70;
  string local_50;
  
  local_78 = _term(this);
  while( true ) {
    while (this->_token == 0x2d) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"- expected!",&local_79);
      _match(this,'-',&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      dVar1 = _term(this);
      local_78 = local_78 - dVar1;
    }
    if (this->_token != 0x2b) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"+ expected!",&local_79);
    _match(this,'+',&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    dVar1 = _term(this);
    local_78 = local_78 + dVar1;
  }
  return local_78;
}

Assistant:

double ExpressionEvaluator::_expr()
{
	/* expr -> term  { '+' term | '-' term } */

	auto result = _term();
	while ((_token == '+') || (_token == '-'))
	{
		if (_token == '+')
		{
			_match('+', "+ expected!");
			result += _term();
		}
		else
		{
			_match('-', "- expected!");
			result -= _term();
		}
	}
	return result;
}